

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O2

type * __thiscall
jsoncons::basic_staj_event<char>::get_<std::__cxx11::string,std::allocator<char>,char>
          (type *__return_storage_ptr__,basic_staj_event<char> *this,undefined8 param_3,
          error_code *param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t sVar3;
  size_type sVar4;
  long lStack_30;
  value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  converter;
  value_converter<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  converter_1;
  
  switch(this->event_type_) {
  case key:
  case string_value:
    pcVar2 = (this->value_).string_data_;
    sVar3 = this->length_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar3);
    break;
  case byte_string_value:
    _converter_1 = this->value_;
    value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert<char>(__return_storage_ptr__,&converter,(byte_string_view *)&converter_1,this->tag_,
                    param_4);
    break;
  case null_value:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined4 *)&__return_storage_ptr__->field_2 = 0x6c6c756e;
    __return_storage_ptr__->_M_string_length = 4;
    (__return_storage_ptr__->field_2)._M_local_buf[4] = '\0';
    break;
  case bool_value:
    paVar1 = &__return_storage_ptr__->field_2;
    if ((this->value_).bool_value_ == false) {
      (__return_storage_ptr__->field_2)._M_local_buf[4] = 'e';
      *(undefined4 *)paVar1 = 0x736c6166;
      sVar4 = 5;
      lStack_30 = 0x15;
    }
    else {
      *(undefined4 *)paVar1 = 0x65757274;
      sVar4 = 4;
      lStack_30 = 0x14;
    }
    *(undefined1 *)((long)&(__return_storage_ptr__->_M_dataplus)._M_p + lStack_30) = 0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    __return_storage_ptr__->_M_string_length = sVar4;
    break;
  case int64_value:
    value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert(__return_storage_ptr__,
              (value_converter<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)&converter_1,(this->value_).int64_value_,this->tag_,param_4);
    break;
  case uint64_value:
    value_converter<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert(__return_storage_ptr__,&converter_1,(this->value_).uint64_value_,this->tag_,param_4);
    break;
  default:
    std::error_code::operator=(param_4,not_string);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    break;
  case half_value:
    value_converter<jsoncons::half_arg_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert(__return_storage_ptr__,
              (value_converter<jsoncons::half_arg_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)&converter_1,(this->value_).half_value_,this->tag_,param_4);
    break;
  case double_value:
    value_converter<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert(__return_storage_ptr__,
              (value_converter<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)&converter_1,(this->value_).double_value_,this->tag_,param_4);
  }
  return __return_storage_ptr__;
}

Assistant:

typename std::enable_if<ext_traits::is_string<T>::value && std::is_same<typename T::value_type, CharT_>::value, T>::type
    get_(Allocator,std::error_code& ec) const
    {
        switch (event_type_)
        {
            case staj_event_type::key:
            case staj_event_type::string_value:
            {
                value_converter<jsoncons::basic_string_view<CharT>,T> converter;
                return converter.convert(jsoncons::basic_string_view<CharT>(value_.string_data_, length_), tag(), ec);
            }
            case staj_event_type::byte_string_value:
            {
                value_converter<jsoncons::byte_string_view,T> converter;
                return converter.convert(byte_string_view(value_.byte_string_data_,length_),tag(),ec);
            }
            case staj_event_type::uint64_value:
            {
                value_converter<uint64_t,T> converter;
                return converter.convert(value_.uint64_value_, tag(), ec);
            }
            case staj_event_type::int64_value:
            {
                value_converter<int64_t,T> converter;
                return converter.convert(value_.int64_value_, tag(), ec);
            }
            case staj_event_type::half_value:
            {
                value_converter<half_arg_t,T> converter;
                return converter.convert(value_.half_value_, tag(), ec);
            }
            case staj_event_type::double_value:
            {
                value_converter<double,T> converter;
                return converter.convert(value_.double_value_, tag(), ec);
            }
            case staj_event_type::bool_value:
            {
                value_converter<bool,T> converter;
                return converter.convert(value_.bool_value_,tag(),ec);
            }
            case staj_event_type::null_value:
            {
                value_converter<null_type,T> converter;
                return converter.convert(tag(), ec);
            }
            default:
            {
                ec = conv_errc::not_string;
                return T{};
            }
        }
    }